

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  __pid_t _Var8;
  uint uVar9;
  uint64_t uVar10;
  uint64_t extraout_RAX;
  uint64_t extraout_RAX_00;
  char *extraout_RAX_01;
  longlong lVar11;
  long lVar12;
  uint32_t *puVar13;
  char *pcVar14;
  char *pcVar15;
  uint32_t uVar16;
  char *pcStack_90;
  char **ppcStack_88;
  code *pcStack_80;
  int err;
  addrinfo *res;
  addrinfo local_60;
  
  uVar9 = bufferSizeMilliseconds;
  uVar7 = clockMicros;
  uVar1 = clockPeripheral;
  uVar2 = DMAprimaryChannel;
  uVar3 = DMAsecondaryChannel;
  uVar4 = socketPort;
  uVar5 = memAllocMode;
  uVar16 = cfgInternals;
LAB_001024ad:
  do {
    cfgInternals = uVar16;
    memAllocMode = uVar5;
    socketPort = uVar4;
    DMAsecondaryChannel = uVar3;
    DMAprimaryChannel = uVar2;
    clockPeripheral = uVar1;
    clockMicros = uVar7;
    bufferSizeMilliseconds = uVar9;
    pcStack_80 = (code *)0x1024ba;
    puVar13 = (uint32_t *)argv;
    iVar6 = getopt(argc,argv,"a:b:c:d:e:fgkln:mp:s:t:x:vV");
    pcVar14 = _optarg;
    uVar9 = bufferSizeMilliseconds;
    uVar7 = clockMicros;
    uVar1 = clockPeripheral;
    uVar2 = DMAprimaryChannel;
    uVar3 = DMAsecondaryChannel;
    uVar4 = socketPort;
    uVar5 = memAllocMode;
    uVar16 = cfgInternals;
    switch(iVar6) {
    case 0x56:
    case 0x76:
      pcStack_80 = (code *)0x102902;
      printf("%d\n",0x49);
LAB_00102902:
      pcStack_80 = (code *)0x102909;
      exit(0);
    case 0x61:
      pcStack_80 = (code *)0x1024db;
      uVar10 = getNum(_optarg,&err);
      uVar9 = bufferSizeMilliseconds;
      uVar7 = clockMicros;
      uVar1 = clockPeripheral;
      uVar2 = DMAprimaryChannel;
      uVar3 = DMAsecondaryChannel;
      uVar4 = socketPort;
      uVar5 = (uint)uVar10;
      uVar16 = cfgInternals;
      if (2 < (uint)uVar10) {
        pcVar14 = "invalid -a option (%d)";
        goto LAB_00102978;
      }
      break;
    case 0x62:
      pcStack_80 = (code *)0x102620;
      uVar10 = getNum(_optarg,&err);
      uVar9 = (uint)uVar10;
      uVar7 = clockMicros;
      uVar1 = clockPeripheral;
      uVar2 = DMAprimaryChannel;
      uVar3 = DMAsecondaryChannel;
      uVar4 = socketPort;
      uVar5 = memAllocMode;
      uVar16 = cfgInternals;
      if (0x26ac < (uint)uVar10 - 100) {
        pcVar14 = "invalid -b option (%d)";
        goto LAB_00102978;
      }
      break;
    case 99:
      pcStack_80 = (code *)0x102686;
      uVar10 = getNum(_optarg,&err);
      uVar9 = bufferSizeMilliseconds;
      uVar7 = clockMicros;
      uVar1 = clockPeripheral;
      uVar2 = DMAprimaryChannel;
      uVar3 = DMAsecondaryChannel;
      uVar4 = socketPort;
      uVar5 = memAllocMode;
      uVar16 = (uint)uVar10;
      if (0x7ff < (uint)uVar10) {
        pcVar14 = "invalid -c option (%x)";
        goto LAB_00102978;
      }
      break;
    case 100:
      pcStack_80 = (code *)0x1026c0;
      uVar10 = getNum(_optarg,&err);
      uVar9 = bufferSizeMilliseconds;
      uVar7 = clockMicros;
      uVar1 = clockPeripheral;
      uVar2 = (uint)uVar10;
      uVar3 = DMAsecondaryChannel;
      uVar4 = socketPort;
      uVar5 = memAllocMode;
      uVar16 = cfgInternals;
      if (0xf < (uint)uVar10) {
        pcVar14 = "invalid -d option (%d)";
        goto LAB_00102978;
      }
      break;
    case 0x65:
      pcStack_80 = (code *)0x102646;
      uVar10 = getNum(_optarg,&err);
      uVar9 = bufferSizeMilliseconds;
      uVar7 = clockMicros;
      uVar1 = clockPeripheral;
      uVar2 = DMAprimaryChannel;
      uVar3 = (uint)uVar10;
      uVar4 = socketPort;
      uVar5 = memAllocMode;
      uVar16 = cfgInternals;
      if (0xf < (uint)uVar10) {
        pcVar14 = "invalid -e option (%d)";
        goto LAB_00102978;
      }
      break;
    case 0x66:
      ifFlags = ifFlags | 1;
      break;
    case 0x67:
      foreground = '\x01';
      break;
    case 0x6b:
      ifFlags = ifFlags | 2;
      break;
    case 0x6c:
      ifFlags = ifFlags | 4;
      break;
    case 0x6d:
      ifFlags = ifFlags | 8;
      break;
    case 0x6e:
      pcStack_80 = (code *)0x102562;
      pcVar15 = getenv("PIGPIO_PORT");
      if (pcVar15 == (char *)0x0) {
        pcVar15 = "8888";
      }
      local_60.ai_next = (addrinfo *)0x0;
      local_60.ai_addrlen = 0;
      local_60._20_4_ = 0;
      local_60.ai_addr = (sockaddr *)0x0;
      local_60.ai_canonname = (char *)0x0;
      local_60.ai_socktype = 1;
      local_60.ai_protocol = 0;
      local_60.ai_flags = 2;
      local_60.ai_family = 2;
      pcStack_80 = (code *)0x1025b0;
      iVar6 = getaddrinfo(pcVar14,pcVar15,&local_60,(addrinfo **)&res);
      uVar16 = 0;
      if (iVar6 == 0) {
        uVar16 = *(uint32_t *)(res->ai_addr->sa_data + 2);
        pcStack_80 = (code *)0x1025c9;
        freeaddrinfo((addrinfo *)res);
      }
      if ((uVar16 == 0) || (0xff < numSockNetAddr)) {
        pcVar15 = "invalid -n option (%s)";
        pcVar14 = _optarg;
        goto LAB_00102958;
      }
      lVar12 = (long)numSockNetAddr;
      numSockNetAddr = numSockNetAddr + 1;
      sockNetAddr[lVar12] = uVar16;
      uVar9 = bufferSizeMilliseconds;
      uVar7 = clockMicros;
      uVar1 = clockPeripheral;
      uVar2 = DMAprimaryChannel;
      uVar3 = DMAsecondaryChannel;
      uVar4 = socketPort;
      uVar5 = memAllocMode;
      uVar16 = cfgInternals;
      break;
    case 0x70:
      pcStack_80 = (code *)0x1026e0;
      uVar10 = getNum(_optarg,&err);
      uVar9 = bufferSizeMilliseconds;
      uVar7 = clockMicros;
      uVar1 = clockPeripheral;
      uVar2 = DMAprimaryChannel;
      uVar3 = DMAsecondaryChannel;
      uVar4 = (uint)uVar10;
      uVar5 = memAllocMode;
      uVar16 = cfgInternals;
      if (0x7900 < (uint)uVar10 - 0x400) goto LAB_0010295f;
      break;
    case 0x73:
      pcStack_80 = (code *)0x1024f8;
      uVar10 = getNum(_optarg,&err);
      uVar7 = (uint)uVar10;
      if (10 < uVar7) goto LAB_00102981;
      uVar9 = bufferSizeMilliseconds;
      uVar1 = clockPeripheral;
      uVar2 = DMAprimaryChannel;
      uVar3 = DMAsecondaryChannel;
      uVar4 = socketPort;
      uVar5 = memAllocMode;
      uVar16 = cfgInternals;
      if ((0x536U >> (uVar7 & 0x1f) & 1) == 0) goto LAB_00102981;
      break;
    case 0x74:
      goto switchD_001024cd_caseD_74;
    case 0x78:
      pcStack_80 = (code *)0x102523;
      uVar10 = getNum(_optarg,&err);
      if (err != 0) {
        pcVar15 = "invalid -x option (%s)";
        pcVar14 = _optarg;
LAB_00102958:
        pcStack_80 = (code *)0x10295f;
        fatal(pcVar15,pcVar14);
        uVar10 = extraout_RAX;
LAB_0010295f:
        pcVar14 = "invalid -p option (%d)";
        goto LAB_00102978;
      }
      updateMaskSet = '\x01';
      uVar9 = bufferSizeMilliseconds;
      uVar7 = clockMicros;
      uVar1 = clockPeripheral;
      uVar2 = DMAprimaryChannel;
      uVar3 = DMAsecondaryChannel;
      uVar4 = socketPort;
      updateMask = uVar10;
      uVar5 = memAllocMode;
      uVar16 = cfgInternals;
      break;
    default:
      if (iVar6 == -1) {
        if (foreground == '\0') {
          pcStack_80 = (code *)0x102720;
          _Var8 = fork();
          if (_Var8 < 0) goto LAB_0010290e;
          if (_Var8 != 0) goto LAB_00102902;
          pcStack_80 = (code *)0x102735;
          umask(0);
          pcStack_80 = (code *)0x10273a;
          _Var8 = setsid();
          if (_Var8 < 0) {
            pcVar14 = "setsid failed (%m)";
            goto LAB_001029b3;
          }
          pcStack_80 = (code *)0x10274e;
          iVar6 = chdir("/");
          if (iVar6 < 0) {
            pcVar14 = "chdir failed (%m)";
            goto LAB_001029b3;
          }
          pcStack_80 = (code *)0x102765;
          fclose(_stdin);
          pcStack_80 = (code *)0x102774;
          fclose(_stdout);
        }
        pcStack_80 = (code *)0x10277f;
        gpioCfgBufferSize(bufferSizeMilliseconds);
        pcStack_80 = (code *)0x102792;
        gpioCfgClock(clockMicros,clockPeripheral,0);
        pcStack_80 = (code *)0x10279d;
        gpioCfgInterfaces(ifFlags);
        pcStack_80 = (code *)0x1027ae;
        gpioCfgDMAchannels(DMAprimaryChannel,DMAsecondaryChannel);
        pcStack_80 = (code *)0x1027b9;
        gpioCfgSocketPort(socketPort);
        pcStack_80 = (code *)0x1027c4;
        gpioCfgMemAlloc(memAllocMode);
        if (updateMaskSet == '\x01') {
          pcStack_80 = (code *)0x1027d9;
          gpioCfgPermissions(updateMask);
        }
        puVar13 = sockNetAddr;
        pcStack_80 = (code *)0x1027eb;
        gpioCfgNetAddr(numSockNetAddr);
        pcStack_80 = (code *)0x1027f6;
        gpioCfgSetInternals(cfgInternals);
        pcStack_80 = (code *)0x1027fb;
        iVar6 = gpioInitialise();
        if (iVar6 < 0) {
          pcVar14 = "Can\'t initialise pigpio library";
LAB_001029b3:
          pcStack_80 = getNum;
          fatal(pcVar14);
          pcStack_80 = (code *)0x1035d6;
          *puVar13 = 0;
          pcStack_90 = extraout_RAX_01;
          ppcStack_88 = argv;
          lVar11 = strtoll(pcVar14,&pcStack_90,0);
          iVar6 = (int)lVar11;
          if (*pcStack_90 != '\0') {
            *puVar13 = 1;
            iVar6 = -1;
          }
          return iVar6;
        }
        pcStack_80 = (code *)0x102812;
        unlink("/dev/pigerr");
        pcStack_80 = (code *)0x10281f;
        mkfifo("/dev/pigerr",0x1b4);
        pcStack_80 = (code *)0x10282c;
        iVar6 = chmod("/dev/pigerr",0x1b4);
        if (-1 < iVar6) {
          pcStack_80 = (code *)0x102851;
          errFifo = (FILE *)freopen("/dev/pigerr","w+",_stderr);
          if ((FILE *)errFifo == (FILE *)0x0) {
            pcStack_80 = (code *)0x1028db;
            fprintf(_stderr,"freopen failed (%m)");
            pcStack_80 = (code *)0x1028e0;
            gpioTerminate();
            return 0;
          }
          pcStack_80 = (code *)0x102865;
          iVar6 = fileno((FILE *)errFifo);
          pcStack_80 = (code *)0x102873;
          uVar9 = fcntl(iVar6,3,0);
          pcStack_80 = (code *)0x102881;
          iVar6 = fileno((FILE *)errFifo);
          pcStack_80 = (code *)0x102895;
          fcntl(iVar6,4,(ulong)(uVar9 | 0x800));
          pcStack_80 = (code *)0x1028a7;
          gpioSetSignalFunc(1,terminate);
          pcStack_80 = (code *)0x1028b2;
          gpioSetSignalFunc(0xf,terminate);
          do {
            pcStack_80 = (code *)0x1028bc;
            sleep(5);
            pcStack_80 = (code *)0x1028c8;
            fflush((FILE *)errFifo);
          } while( true );
        }
        pcVar15 = "chmod %s failed (%m)";
        pcVar14 = "/dev/pigerr";
        goto LAB_00102958;
      }
    case 0x57:
    case 0x58:
    case 0x59:
    case 0x5a:
    case 0x5b:
    case 0x5c:
    case 0x5d:
    case 0x5e:
    case 0x5f:
    case 0x60:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6f:
    case 0x71:
    case 0x72:
    case 0x75:
    case 0x77:
      pcStack_80 = (code *)0x10290e;
      usage();
LAB_0010290e:
      pcStack_80 = (code *)0x102916;
      exit(1);
    }
  } while( true );
switchD_001024cd_caseD_74:
  pcStack_80 = (code *)0x102666;
  uVar10 = getNum(_optarg,&err);
  uVar9 = bufferSizeMilliseconds;
  uVar7 = clockMicros;
  uVar1 = (uint)uVar10;
  uVar2 = DMAprimaryChannel;
  uVar3 = DMAsecondaryChannel;
  uVar4 = socketPort;
  uVar5 = memAllocMode;
  uVar16 = cfgInternals;
  if (1 < (uint)uVar10) {
    pcVar14 = "invalid -t option (%d)";
LAB_00102978:
    do {
      pcStack_80 = (code *)0x102981;
      fatal(pcVar14,uVar10 & 0xffffffff);
      uVar10 = extraout_RAX_00;
LAB_00102981:
      pcVar14 = "invalid -s option (%d)";
    } while( true );
  }
  goto LAB_001024ad;
}

Assistant:

int main(int argc, char **argv)
{
   pid_t pid;
   int flags;

   /* check command line parameters */

   initOpts(argc, argv);

   if (!foreground) {
      /* Fork off the parent process */

      pid = fork();

      if (pid < 0) { exit(EXIT_FAILURE); }

      /* If we got a good PID, then we can exit the parent process. */

      if (pid > 0) { exit(EXIT_SUCCESS); }

      /* Change the file mode mask */

      umask(0);

      /* Open any logs here */

      /* NONE */

      /* Create a new SID for the child process */

      if (setsid() < 0) fatal("setsid failed (%m)");

      /* Change the current working directory */

      if ((chdir("/")) < 0) fatal("chdir failed (%m)");

      /* Close out the standard file descriptors */

      fclose(stdin);
      fclose(stdout);
   }

   /* configure library */

   gpioCfgBufferSize(bufferSizeMilliseconds);

   gpioCfgClock(clockMicros, clockPeripheral, 0);

   gpioCfgInterfaces(ifFlags);

   gpioCfgDMAchannels(DMAprimaryChannel, DMAsecondaryChannel);

   gpioCfgSocketPort(socketPort);

   gpioCfgMemAlloc(memAllocMode);

   if (updateMaskSet) gpioCfgPermissions(updateMask);

   gpioCfgNetAddr(numSockNetAddr, sockNetAddr);

   gpioCfgSetInternals(cfgInternals);

   /* start library */

   if (gpioInitialise()< 0) fatal("Can't initialise pigpio library");

   /* create pipe for error reporting */

   unlink(PI_ERRFIFO);

   mkfifo(PI_ERRFIFO, 0664);

   if (chmod(PI_ERRFIFO, 0664) < 0)
      fatal("chmod %s failed (%m)", PI_ERRFIFO);

   errFifo = freopen(PI_ERRFIFO, "w+", stderr);

   if (errFifo)
   {
      /* set stderr non-blocking */

      flags = fcntl(fileno(errFifo), F_GETFL, 0);
      fcntl(fileno(errFifo), F_SETFL, flags | O_NONBLOCK);

      /* request SIGHUP/SIGTERM from libarary for termination */

      gpioSetSignalFunc(SIGHUP, terminate);
      gpioSetSignalFunc(SIGTERM, terminate);

      /* sleep forever */

      while (1)
      {
         /* cat /dev/pigerr to view daemon errors */

         sleep(5);

         fflush(errFifo);
      }
   }
   else
   {
      fprintf(stderr, "freopen failed (%m)");

      gpioTerminate();
   }

   return 0;
}